

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void google::protobuf::compiler::cpp::anon_unknown_9::CollectMacroNames
               (Descriptor *message,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  long lVar2;
  int i;
  long lVar3;
  long lVar4;
  
  lVar3 = 0;
  do {
    if (*(int *)(message + 0x2c) <= lVar3) {
      lVar4 = 0;
      for (lVar3 = 0; lVar3 < *(int *)(message + 0x48); lVar3 = lVar3 + 1) {
        CollectMacroNames((Descriptor *)(*(long *)(message + 0x50) + lVar4),names);
        lVar4 = lVar4 + 0xa8;
      }
      return;
    }
    lVar4 = *(long *)(message + 0x30);
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             (lVar4 + lVar3 * 0xa8);
    lVar2 = 0;
    do {
      if (lVar2 == 8) goto LAB_0027520e;
      bVar1 = std::operator==(__lhs,(char *)((long)&
                                                  _ZN6google8protobuf8compiler3cpp12_GLOBAL__N_111kMacroNamesE_rel
                                            + (long)*(int *)((long)&
                                                  _ZN6google8protobuf8compiler3cpp12_GLOBAL__N_111kMacroNamesE_rel
                                                  + lVar2)));
      lVar2 = lVar2 + 4;
    } while (!bVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(names,*(value_type **)(lVar4 + lVar3 * 0xa8));
LAB_0027520e:
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void CollectMacroNames(const Descriptor* message, std::vector<string>* names) {
  for (int i = 0; i < message->field_count(); ++i) {
    const FieldDescriptor* field = message->field(i);
    if (IsMacroName(field->name())) {
      names->push_back(field->name());
    }
  }
  for (int i = 0; i < message->nested_type_count(); ++i) {
    CollectMacroNames(message->nested_type(i), names);
  }
}